

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void SerializeContainers(CJSON *json)

{
  ostream *poVar1;
  mapped_type *pmVar2;
  mapped_type *pmVar3;
  string local_6c8;
  value_type_conflict1 local_6a8 [2];
  undefined1 local_6a0 [8];
  vector<int,_std::allocator<int>_> ivec;
  int local_65c;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_658;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  local_630;
  int local_624;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_620;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  local_5f8;
  int local_5ec;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_5e8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  local_5c0;
  int local_5b4;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_5b0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  local_588;
  int local_57c;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_578;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  local_550;
  int local_544;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_540;
  undefined1 local_518 [8];
  unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ummap;
  allocator<char> local_4b9;
  key_type local_4b8;
  allocator<char> local_491;
  key_type local_490;
  allocator<char> local_469;
  key_type local_468;
  undefined1 local_448 [8];
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  umap;
  int local_3e4;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_3e0;
  _Base_ptr local_3b8;
  int local_3ac;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_3a8;
  _Base_ptr local_380;
  int local_374;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_370;
  _Base_ptr local_348;
  int local_33c;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_338;
  _Base_ptr local_310;
  int local_304;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_300;
  _Base_ptr local_2d8;
  int local_2cc;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_2c8;
  undefined1 local_2a0 [8];
  multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  mmap;
  allocator<char> local_249;
  key_type local_248;
  allocator<char> local_221;
  key_type local_220;
  allocator<char> local_1f9;
  key_type local_1f8;
  allocator<char> local_1d1;
  key_type local_1d0;
  undefined1 local_1b0 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  jobj;
  int local_178;
  int local_174;
  forward_list<int,_std::allocator<int>_> local_170;
  forward_list<int,_std::allocator<int>_> flist;
  allocator<char> local_141;
  value_type local_140;
  allocator<char> local_119;
  value_type local_118;
  allocator<char> local_f1;
  value_type local_f0;
  allocator<char> local_c9;
  value_type local_c8;
  undefined1 local_a8 [8];
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dequeue;
  string local_48;
  undefined1 auStack_28 [8];
  array<int,_5UL> arr;
  CJSON *json_local;
  
  unique0x10001440 = json;
  poVar1 = std::operator<<((ostream *)&std::cout,"-------------------Serialize-------------------\n"
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  auStack_28._0_4_ = 1;
  auStack_28._4_4_ = 2;
  arr._M_elems[0] = 3;
  arr._M_elems[1] = 4;
  arr._M_elems[2] = 5;
  poVar1 = std::operator<<((ostream *)&std::cout,"std::array: ");
  CJSON::Serialize<std::array<int,_5UL>,_nullptr>
            (&local_48,stack0xfffffffffffffff0,(array<int,_5UL> *)auStack_28);
  poVar1 = std::operator<<(poVar1,(string *)&local_48);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_48);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"Test",&local_c9);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_a8,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator(&local_c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"Hallo",&local_f1);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_a8,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator(&local_f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"Welt",&local_119);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_a8,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator(&local_119);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,"List",&local_141);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_a8,&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator(&local_141);
  poVar1 = std::operator<<((ostream *)&std::cout,"std::deque: ");
  CJSON::
  Serialize<std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_nullptr>
            ((string *)&flist,stack0xfffffffffffffff0,
             (deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_a8);
  poVar1 = std::operator<<(poVar1,(string *)&flist);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&flist);
  std::forward_list<int,_std::allocator<int>_>::forward_list(&local_170);
  local_174 = 5;
  std::forward_list<int,_std::allocator<int>_>::push_front(&local_170,&stack0xfffffffffffffe8c);
  local_178 = 3;
  std::forward_list<int,_std::allocator<int>_>::push_front(&local_170,&stack0xfffffffffffffe88);
  jobj._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 2;
  std::forward_list<int,_std::allocator<int>_>::push_front
            (&local_170,(int *)((long)&jobj._M_t._M_impl.super__Rb_tree_header._M_node_count + 4));
  jobj._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 7;
  std::forward_list<int,_std::allocator<int>_>::push_front
            (&local_170,(int *)&jobj._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
         *)local_1b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,"Num1",&local_1d1);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                         *)local_1b0,&local_1d0);
  *pmVar2 = 5;
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8,"Num5",&local_1f9);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                         *)local_1b0,&local_1f8);
  *pmVar2 = 6;
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator(&local_1f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_220,"Num4",&local_221);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                         *)local_1b0,&local_220);
  *pmVar2 = 8;
  std::__cxx11::string::~string((string *)&local_220);
  std::allocator<char>::~allocator(&local_221);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,"Num2",&local_249);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                         *)local_1b0,&local_248);
  *pmVar2 = 9;
  std::__cxx11::string::~string((string *)&local_248);
  std::allocator<char>::~allocator(&local_249);
  poVar1 = std::operator<<((ostream *)&std::cout,"std::map: ");
  CJSON::
  Serialize<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_nullptr>
            ((string *)&mmap._M_t._M_impl.super__Rb_tree_header._M_node_count,
             stack0xfffffffffffffff0,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              *)local_1b0);
  poVar1 = std::operator<<(poVar1,(string *)&mmap._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&mmap._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::multimap((multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              *)local_2a0);
  local_2cc = 1;
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[5],_int,_true>(&local_2c8,(char (*) [5])0x17e175,&local_2cc);
  local_2d8 = (_Base_ptr)
              std::
              multimap<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
              ::insert<std::pair<std::__cxx11::string,int>>
                        ((multimap<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                          *)local_2a0,&local_2c8);
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  ~pair(&local_2c8);
  local_304 = 2;
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[5],_int,_true>(&local_300,(char (*) [5])0x17e175,&local_304);
  local_310 = (_Base_ptr)
              std::
              multimap<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
              ::insert<std::pair<std::__cxx11::string,int>>
                        ((multimap<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                          *)local_2a0,&local_300);
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  ~pair(&local_300);
  local_33c = 3;
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[5],_int,_true>(&local_338,(char (*) [5])0x17e175,&local_33c);
  local_348 = (_Base_ptr)
              std::
              multimap<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
              ::insert<std::pair<std::__cxx11::string,int>>
                        ((multimap<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                          *)local_2a0,&local_338);
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  ~pair(&local_338);
  local_374 = 4;
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[6],_int,_true>(&local_370,(char (*) [6])"Test1",&local_374);
  local_380 = (_Base_ptr)
              std::
              multimap<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
              ::insert<std::pair<std::__cxx11::string,int>>
                        ((multimap<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                          *)local_2a0,&local_370);
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  ~pair(&local_370);
  local_3ac = 1;
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[6],_int,_true>(&local_3a8,(char (*) [6])"Test2",&local_3ac);
  local_3b8 = (_Base_ptr)
              std::
              multimap<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
              ::insert<std::pair<std::__cxx11::string,int>>
                        ((multimap<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                          *)local_2a0,&local_3a8);
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  ~pair(&local_3a8);
  local_3e4 = 5;
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[6],_int,_true>(&local_3e0,(char (*) [6])"Test1",&local_3e4);
  std::
  multimap<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
  ::insert<std::pair<std::__cxx11::string,int>>
            ((multimap<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
              *)local_2a0,&local_3e0);
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  ~pair(&local_3e0);
  poVar1 = std::operator<<((ostream *)&std::cout,"std::multimap: ");
  CJSON::
  Serialize<std::multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_nullptr>
            ((string *)&umap._M_h._M_single_bucket,stack0xfffffffffffffff0,
             (multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              *)local_2a0);
  poVar1 = std::operator<<(poVar1,(string *)&umap._M_h._M_single_bucket);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&umap._M_h._M_single_bucket);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   *)local_448);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_468,"Test",&local_469);
  pmVar3 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                         *)local_448,&local_468);
  *pmVar3 = 5;
  std::__cxx11::string::~string((string *)&local_468);
  std::allocator<char>::~allocator(&local_469);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_490,"Test2",&local_491);
  pmVar3 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                         *)local_448,&local_490);
  *pmVar3 = 2;
  std::__cxx11::string::~string((string *)&local_490);
  std::allocator<char>::~allocator(&local_491);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4b8,"Test4",&local_4b9);
  pmVar3 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                         *)local_448,&local_4b8);
  *pmVar3 = 4;
  std::__cxx11::string::~string((string *)&local_4b8);
  std::allocator<char>::~allocator(&local_4b9);
  poVar1 = std::operator<<((ostream *)&std::cout,"std::unordered_map: ");
  CJSON::
  Serialize<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_nullptr>
            ((string *)&ummap._M_h._M_single_bucket,stack0xfffffffffffffff0,
             (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              *)local_448);
  poVar1 = std::operator<<(poVar1,(string *)&ummap._M_h._M_single_bucket);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&ummap._M_h._M_single_bucket);
  std::
  unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::unordered_multimap
            ((unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              *)local_518);
  local_544 = 1;
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[5],_int,_true>(&local_540,(char (*) [5])0x17e175,&local_544);
  local_550._M_cur =
       (__node_type *)
       std::
       unordered_multimap<std::__cxx11::string,int,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
       ::insert<std::pair<std::__cxx11::string,int>>
                 ((unordered_multimap<std::__cxx11::string,int,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                   *)local_518,&local_540);
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  ~pair(&local_540);
  local_57c = 2;
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[5],_int,_true>(&local_578,(char (*) [5])0x17e175,&local_57c);
  local_588._M_cur =
       (__node_type *)
       std::
       unordered_multimap<std::__cxx11::string,int,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
       ::insert<std::pair<std::__cxx11::string,int>>
                 ((unordered_multimap<std::__cxx11::string,int,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                   *)local_518,&local_578);
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  ~pair(&local_578);
  local_5b4 = 3;
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[5],_int,_true>(&local_5b0,(char (*) [5])0x17e175,&local_5b4);
  local_5c0._M_cur =
       (__node_type *)
       std::
       unordered_multimap<std::__cxx11::string,int,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
       ::insert<std::pair<std::__cxx11::string,int>>
                 ((unordered_multimap<std::__cxx11::string,int,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                   *)local_518,&local_5b0);
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  ~pair(&local_5b0);
  local_5ec = 4;
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[6],_int,_true>(&local_5e8,(char (*) [6])"Test1",&local_5ec);
  local_5f8._M_cur =
       (__node_type *)
       std::
       unordered_multimap<std::__cxx11::string,int,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
       ::insert<std::pair<std::__cxx11::string,int>>
                 ((unordered_multimap<std::__cxx11::string,int,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                   *)local_518,&local_5e8);
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  ~pair(&local_5e8);
  local_624 = 1;
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[6],_int,_true>(&local_620,(char (*) [6])"Test2",&local_624);
  local_630._M_cur =
       (__node_type *)
       std::
       unordered_multimap<std::__cxx11::string,int,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
       ::insert<std::pair<std::__cxx11::string,int>>
                 ((unordered_multimap<std::__cxx11::string,int,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                   *)local_518,&local_620);
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  ~pair(&local_620);
  local_65c = 5;
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[6],_int,_true>(&local_658,(char (*) [6])"Test1",&local_65c);
  std::
  unordered_multimap<std::__cxx11::string,int,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
  ::insert<std::pair<std::__cxx11::string,int>>
            ((unordered_multimap<std::__cxx11::string,int,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
              *)local_518,&local_658);
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  ~pair(&local_658);
  poVar1 = std::operator<<((ostream *)&std::cout,"std::unordered_multimap: ");
  CJSON::
  Serialize<std::unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_nullptr>
            ((string *)
             &ivec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,stack0xfffffffffffffff0,
             (unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              *)local_518);
  poVar1 = std::operator<<(poVar1,(string *)
                                  &ivec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string
            ((string *)
             &ivec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_6a0);
  local_6a8[1] = 3;
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)local_6a0,local_6a8 + 1);
  local_6a8[0] = 0x23;
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)local_6a0,local_6a8);
  poVar1 = std::operator<<((ostream *)&std::cout,"std::vector: ");
  CJSON::Serialize<std::vector<int,_std::allocator<int>_>,_nullptr>
            (&local_6c8,stack0xfffffffffffffff0,(vector<int,_std::allocator<int>_> *)local_6a0);
  poVar1 = std::operator<<(poVar1,(string *)&local_6c8);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_6c8);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_6a0);
  std::
  unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~unordered_multimap
            ((unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              *)local_518);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    *)local_448);
  std::
  multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~multimap((multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *)local_2a0);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          *)local_1b0);
  std::forward_list<int,_std::allocator<int>_>::~forward_list(&local_170);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_a8);
  return;
}

Assistant:

void SerializeContainers(CJSON &json)
{
    cout << "-------------------Serialize-------------------\n" << endl;

    array<int, 5> arr = {1, 2, 3, 4, 5};
    cout << "std::array: " << json.Serialize(arr) << endl;

    deque<string> dequeue;
    dequeue.push_back("Test");
    dequeue.push_back("Hallo");
    dequeue.push_back("Welt");
    dequeue.push_back("List");
    cout << "std::deque: " << json.Serialize(dequeue) << endl;

    forward_list<int> flist;
    flist.push_front(5);
    flist.push_front(3);
    flist.push_front(2);
    flist.push_front(7);

    map<string, int> jobj;
    jobj["Num1"] = 5;
    jobj["Num5"] = 6;
    jobj["Num4"] = 8;
    jobj["Num2"] = 9;
    cout << "std::map: " << json.Serialize(jobj) << endl;

    multimap<string, int> mmap;
    mmap.insert(pair<string, int>("Test", 1));
    mmap.insert(pair<string, int>("Test", 2));
    mmap.insert(pair<string, int>("Test", 3));
    mmap.insert(pair<string, int>("Test1", 4));
    mmap.insert(pair<string, int>("Test2", 1));
    mmap.insert(pair<string, int>("Test1", 5));
    cout << "std::multimap: " << json.Serialize(mmap) << endl;

    unordered_map<string, int> umap;
    umap["Test"] = 5;
    umap["Test2"] = 2;
    umap["Test4"] = 4;
    cout << "std::unordered_map: " << json.Serialize(umap) << endl;

    unordered_multimap<string, int> ummap;
    ummap.insert(pair<string, int>("Test", 1));
    ummap.insert(pair<string, int>("Test", 2));
    ummap.insert(pair<string, int>("Test", 3));
    ummap.insert(pair<string, int>("Test1", 4));
    ummap.insert(pair<string, int>("Test2", 1));
    ummap.insert(pair<string, int>("Test1", 5));
    cout << "std::unordered_multimap: " << json.Serialize(ummap) << endl;

    vector<int> ivec;
    ivec.push_back(3);
    ivec.push_back(35);
    cout << "std::vector: " << json.Serialize(ivec) << endl;
}